

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzreducedspace.cpp
# Opt level: O2

void __thiscall TPZReducedSpace::InitializeElementMatrix(TPZReducedSpace *this,TPZElementMatrix *ef)

{
  uint num_of_blocks;
  int iVar1;
  int iVar2;
  long lVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TPZCompMesh *pTVar4;
  undefined4 extraout_var_01;
  uint uVar5;
  uint b;
  long lVar6;
  ulong uVar7;
  
  lVar3 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0xb8))();
  num_of_blocks =
       (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0x90))(this);
  iVar1 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 600))(this);
  lVar6 = 1;
  if ((lVar3 != 0) &&
     (lVar3 = __dynamic_cast(lVar3,&TPZMaterial::typeinfo,&TPZMatLoadCasesBase::typeinfo,
                             0xfffffffffffffffe), lVar3 != 0)) {
    lVar6 = (long)*(int *)(lVar3 + 8);
  }
  iVar2 = (*ef->_vptr_TPZElementMatrix[8])(ef);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x70))
            ((long *)CONCAT44(extraout_var,iVar2),(long)iVar1,lVar6);
  iVar1 = (*ef->_vptr_TPZElementMatrix[10])(ef);
  TPZBlock::SetNBlocks((TPZBlock *)CONCAT44(extraout_var_00,iVar1),num_of_blocks);
  pTVar4 = TPZCompEl::Mesh((TPZCompEl *)this);
  ef->fMesh = pTVar4;
  ef->fType = EF;
  b = 0;
  uVar5 = 0;
  if (0 < (int)num_of_blocks) {
    uVar5 = num_of_blocks;
  }
  for (; uVar5 != b; b = b + 1) {
    lVar6 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0xa8))
                      (this,b);
    iVar1 = *(int *)(lVar6 + 0x18);
    iVar2 = (*ef->_vptr_TPZElementMatrix[10])(ef);
    TPZBlock::Set((TPZBlock *)CONCAT44(extraout_var_01,iVar2),b,iVar1,-1);
  }
  TPZManVector<long,_10>::Resize
            (&(ef->fConnect).super_TPZManVector<long,_10>,(long)(int)num_of_blocks);
  for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
    lVar6 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0xa0))
                      (this,uVar7 & 0xffffffff);
    (ef->fConnect).super_TPZManVector<long,_10>.super_TPZVec<long>.fStore[uVar7] = lVar6;
  }
  return;
}

Assistant:

void TPZReducedSpace::InitializeElementMatrix(TPZElementMatrix &ef)
{
    TPZMaterial *mat = this->Material();
	const int numdof = 1;
	const int ncon = this->NConnects();
#ifdef PZDEBUG
    if (ncon != 1) {
        DebugStop();
    }
#endif
	const int nshape = this->NShapeF();
	const int numeq = nshape*numdof;
    const int numloadcases = [mat](){
        if (auto *tmp = dynamic_cast<TPZMatLoadCasesBase*>(mat); tmp){
            return tmp->NumLoadCases();
        }else{
            return 1;
        }
    }();
	ef.Matrix().Redim(numeq,numloadcases);
	ef.Block().SetNBlocks(ncon);
    ef.fMesh = Mesh();
    ef.fType = TPZElementMatrix::EF;
	int i;
	for(i=0; i<ncon; i++){
        unsigned int nshape = Connect(i).NShape();
		ef.Block().Set(i,nshape*numdof);
	}
	ef.fConnect.Resize(ncon);
	for(i=0; i<ncon; i++){
		(ef.fConnect)[i] = ConnectIndex(i);
	}    
}